

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetItem
               (CodedInputStream *input,Message *message)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  uint32_t tag;
  FieldDescriptor *pFVar5;
  ulong uVar6;
  uint uVar7;
  char cVar8;
  uint32_t field_number;
  byte *pbVar9;
  uint32_t uVar10;
  uint size;
  byte unaff_R13B;
  Metadata MVar11;
  string message_data;
  byte *local_b0;
  undefined8 local_a8;
  byte local_a0;
  undefined7 uStack_9f;
  Message *local_90;
  Reflection *local_88;
  CodedInputStream local_80;
  
  local_90 = message;
  MVar11 = Message::GetMetadata(message);
  local_88 = MVar11.reflection;
  local_b0 = &local_a0;
  local_a8 = 0;
  local_a0 = 0;
  cVar8 = '\0';
  field_number = 0;
  do {
    pbVar9 = input->buffer_;
    uVar10 = 0;
    if (pbVar9 < input->buffer_end_) {
      bVar4 = *pbVar9;
      tag = (uint32_t)bVar4;
      uVar10 = (uint32_t)bVar4;
      if ((char)bVar4 < '\0') goto LAB_0026e989;
      input->buffer_ = pbVar9 + 1;
    }
    else {
LAB_0026e989:
      tag = io::CodedInputStream::ReadTagFallback(input,uVar10);
    }
    if ((int)tag < 0x10) {
      if (tag == 0) {
LAB_0026ea5b:
        bVar3 = false;
        unaff_R13B = 0;
      }
      else {
        if (tag == 0xc) {
          unaff_R13B = 1;
          goto LAB_0026eb7d;
        }
LAB_0026e9f6:
        bVar3 = SkipField(input,tag,(UnknownFieldSet *)0x0);
LAB_0026ea53:
        if (bVar3 == false) goto LAB_0026ea5b;
LAB_0026eb76:
        bVar3 = true;
      }
    }
    else {
      if (tag != 0x10) {
        if (tag != 0x1a) goto LAB_0026e9f6;
        if (cVar8 != '\0') {
          if (cVar8 != '\x01') {
            bVar3 = SkipField(input,0x1a,(UnknownFieldSet *)0x0);
            goto LAB_0026ea53;
          }
          pFVar5 = Reflection::FindKnownExtensionByNumber(local_88,field_number);
          bVar3 = ParseAndMergeMessageSetField(field_number,pFVar5,local_90,input);
          cVar8 = '\x03';
          if (!bVar3) {
            cVar8 = '\x01';
            goto LAB_0026ea5b;
          }
          goto LAB_0026eb76;
        }
        pbVar9 = input->buffer_;
        if (pbVar9 < input->buffer_end_) {
          bVar4 = *pbVar9;
          uVar6 = (ulong)bVar4;
          uVar10 = (uint32_t)bVar4;
          if ((char)bVar4 < '\0') goto LAB_0026eb8f;
          input->buffer_ = pbVar9 + 1;
          bVar4 = 0;
        }
        else {
          uVar10 = 0;
LAB_0026eb8f:
          uVar6 = io::CodedInputStream::ReadVarint32Fallback(input,uVar10);
          bVar4 = (byte)(uVar6 >> 0x3f);
        }
        size = (uint)uVar6;
        cVar8 = '\0';
        bVar3 = false;
        bVar2 = 0;
        if (-1 < (int)size && bVar4 == 0) {
          iVar1 = 0x1f;
          if ((size | 1) != 0) {
            for (; (size | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
            }
          }
          std::__cxx11::string::resize
                    ((ulong)&local_b0,(char)(iVar1 * 9 + 0x49U >> 6) + (char)uVar6);
          pbVar9 = local_b0;
          if (size < 0x80) {
            uVar6 = uVar6 & 0xffffffff;
          }
          else {
            uVar6 = uVar6 & 0xffffffff;
            do {
              uVar7 = (uint)uVar6;
              *pbVar9 = (byte)uVar6 | 0x80;
              uVar6 = uVar6 >> 7;
              pbVar9 = pbVar9 + 1;
            } while (0x3fff < uVar7);
          }
          *pbVar9 = (byte)uVar6;
          bVar3 = io::CodedInputStream::ReadRaw(input,pbVar9 + 1,size);
          cVar8 = bVar3 * '\x02';
          bVar2 = bVar3 & unaff_R13B;
        }
        unaff_R13B = bVar2;
        if (bVar3 != false) goto LAB_0026eb76;
        bVar3 = false;
        goto LAB_0026eb7f;
      }
      pbVar9 = input->buffer_;
      if (pbVar9 < input->buffer_end_) {
        bVar4 = *pbVar9;
        uVar6 = (ulong)bVar4;
        uVar10 = (uint32_t)bVar4;
        if ((char)bVar4 < '\0') goto LAB_0026ea68;
        input->buffer_ = pbVar9 + 1;
        bVar3 = true;
      }
      else {
        uVar10 = 0;
LAB_0026ea68:
        uVar6 = io::CodedInputStream::ReadVarint32Fallback(input,uVar10);
        bVar3 = -1 < (long)uVar6;
      }
      uVar10 = (uint32_t)uVar6;
      if ((bool)(bVar3 & uVar10 != 0)) {
        bVar3 = true;
        if (cVar8 == '\0') {
          cVar8 = '\x01';
          field_number = uVar10;
        }
        else if (cVar8 == '\x02') {
          local_80.buffer_ = local_b0;
          local_80.total_bytes_read_ = (int)local_a8;
          local_80.buffer_end_ = local_b0 + local_80.total_bytes_read_;
          local_80.input_ = (ZeroCopyInputStream *)0x0;
          local_80._28_7_ = 0;
          local_80._35_4_ = 0;
          local_80.buffer_size_after_limit_ = 0;
          local_80.total_bytes_limit_ = 0x7fffffff;
          local_80.extension_pool_ = (DescriptorPool *)0x0;
          local_80.extension_factory_ = (MessageFactory *)0x0;
          local_80.recursion_budget_ = input->recursion_budget_;
          local_80.current_limit_ = local_80.total_bytes_read_;
          local_80.recursion_limit_ = local_80.recursion_budget_;
          pFVar5 = Reflection::FindKnownExtensionByNumber(local_88,uVar10);
          bVar3 = ParseAndMergeMessageSetField(uVar10,pFVar5,local_90,&local_80);
          if (bVar3) {
            local_a8 = 0;
            *local_b0 = 0;
            cVar8 = '\x03';
          }
          else {
            cVar8 = '\x02';
            unaff_R13B = 0;
          }
          io::CodedInputStream::~CodedInputStream(&local_80);
        }
      }
      else {
        bVar3 = false;
        unaff_R13B = 0;
      }
      if (bVar3 != false) goto LAB_0026eb76;
LAB_0026eb7d:
      bVar3 = false;
    }
LAB_0026eb7f:
    if (!bVar3) {
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
      }
      return (bool)(unaff_R13B & 1);
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetItem(io::CodedInputStream* input,
                                             Message* message) {
  struct MSReflective {
    bool ParseField(int type_id, io::CodedInputStream* input) {
      const FieldDescriptor* field =
          message_reflection->FindKnownExtensionByNumber(type_id);
      return ParseAndMergeMessageSetField(type_id, field, message, input);
    }

    bool SkipField(uint32_t tag, io::CodedInputStream* input) {
      return WireFormat::SkipField(input, tag, nullptr);
    }

    const Reflection* message_reflection;
    Message* message;
  };

  return ParseMessageSetItemImpl(
      input, MSReflective{message->GetReflection(), message});
}